

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O3

Vec_Mem_t * Vec_MemAllocForTT(int nVars,int fCompl)

{
  size_t __size;
  uint uVar1;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar4 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar4 = 1;
  }
  __size = (long)iVar4 * 8;
  pEntry = (word *)malloc(__size);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar4;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  uVar6 = 9999;
  while( true ) {
    do {
      uVar5 = uVar6;
      uVar6 = uVar5 + 1;
    } while ((uVar5 & 1) != 0);
    if (uVar6 < 9) break;
    iVar4 = 5;
    while (uVar6 % (iVar4 - 2U) != 0) {
      uVar1 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar6 < uVar1) goto LAB_006e2123;
    }
  }
LAB_006e2123:
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar5) {
    uVar1 = uVar6;
  }
  pVVar2->nCap = uVar1;
  piVar3 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar2->pArray = piVar3;
  pVVar2->nSize = uVar6;
  memset(piVar3,0xff,(long)(int)uVar6 << 2);
  p->vTable = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 10000;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(40000);
  pVVar2->pArray = piVar3;
  p->vNexts = pVVar2;
  memset(pEntry,0,__size);
  iVar4 = Vec_MemHashInsert(p,pEntry);
  if (iVar4 == 0) {
    memset(pEntry,0xaa,__size);
    iVar4 = Vec_MemHashInsert(p,pEntry);
    if (iVar4 == 1) {
      if (pEntry != (word *)0x0) {
        free(pEntry);
      }
      return p;
    }
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                  ,0x18e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  __assert_fail("Value == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                ,0x189,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
}

Assistant:

static inline Vec_Mem_t * Vec_MemAllocForTT( int nVars, int fCompl )
{
    int Value, nWords = (nVars <= 6 ? 1 : (1 << (nVars - 6)));
    word * uTruth = ABC_ALLOC( word, nWords ); 
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    memset( uTruth, 0x00, sizeof(word) * nWords );
    Value = Vec_MemHashInsert( vTtMem, uTruth ); assert( Value == 0 );
    if ( fCompl )
        memset( uTruth, 0x55, sizeof(word) * nWords );
    else
        memset( uTruth, 0xAA, sizeof(word) * nWords );
    Value = Vec_MemHashInsert( vTtMem, uTruth ); assert( Value == 1 );
    ABC_FREE( uTruth );
    return vTtMem;
}